

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O2

string * __thiscall
RelPathEnv::ApplyChdir(string *__return_storage_ptr__,RelPathEnv *this,string *s)

{
  char *pcVar1;
  long lVar2;
  string a;
  
  if ((s->_M_string_length == 0) || (*(s->_M_dataplus)._M_p != '/')) {
    std::__cxx11::string::string((string *)&a,(string *)&this->abs_path_);
    while (((a._M_string_length != 0 && (3 < s->_M_string_length)) &&
           (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == '.'))) {
      if (pcVar1[1] == '.') {
        if (pcVar1[2] == '/') {
          lVar2 = std::__cxx11::string::rfind((char)&a,0x2f);
          if (lVar2 == -1) {
            a._M_string_length = 0;
            *a._M_dataplus._M_p = '\0';
          }
          else {
            std::__cxx11::string::erase((ulong)&a,lVar2 + 1);
          }
          std::__cxx11::string::erase((ulong)s,0);
        }
      }
      else if (pcVar1[1] == '/') {
        std::__cxx11::string::erase((ulong)s,0);
      }
    }
    std::operator+(__return_storage_ptr__,&a,s);
    std::__cxx11::string::~string((string *)&a);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

string ApplyChdir(string s) const {
    if (s.size() > 0 && s[0] == '/') {
      return s;
    }
    // Optimization: only simplify ./ and ../ on boundary between a and s.
    // To process all ./ and ../, wrap the following code in a loop. At the end
    // of the loop, search for ./ or ../ and construct new a and s using that as
    // the new boundary.
    //
    // Note: there are dangerous filesystem bugs in assuming that ../ can be
    // simplified in this way. It only "works" when the dir before ../ in the
    // relative path is a physical directory entry (so, no symlinks, FS joins,
    // or other filesystem features).
    string a = AsString();
    while (!a.empty() && s.size() > 3 &&
        s[0] == '.') {
      if (s[1] == '/') {
        s.erase(0, 2);  // Remove "./" from s.
      } else if (s[1] == '.' && s[2] == '/') {
        string::size_type i = a.rfind('/', a.size() - 2);
        if (i == string::npos) {
          a.clear();
        } else {
          i++;
          a.erase(i, a.size() - i);  // Remove "../" from s and one dir from a.
        }
        s.erase(0, 3);
      }
    }
    return a + s;
  }